

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MutexBenchmarks.hpp
# Opt level: O0

void __thiscall
benchmarks::MutexBenchmarks<descriptors::mutex::boost::RecursiveMutex>::MutexBenchmarks
          (MutexBenchmarks<descriptors::mutex::boost::RecursiveMutex> *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  allocator local_69;
  string local_68;
  allocator local_31;
  string local_30;
  MutexBenchmarks<descriptors::mutex::boost::RecursiveMutex> *local_10;
  MutexBenchmarks<descriptors::mutex::boost::RecursiveMutex> *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"mutex",&local_31);
  BenchmarksClass::BenchmarksClass(&this->super_BenchmarksClass,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"basic",&local_69);
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_88);
  BenchmarksClass::AddBenchmark<,void(*)(benchmarks::BenchmarkContext&)>
            (&this->super_BenchmarksClass,&local_68,Basic,&local_88);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  return;
}

Assistant:

MutexBenchmarks()
            : BenchmarksClass("mutex")
        {
            AddBenchmark<>("basic", &MutexBenchmarks::Basic);
        }